

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
          (InternalMetadata *this,string *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  if ((this->ptr_ & 1U) == 0) {
    pbVar1 = mutable_unknown_fields_slow<std::__cxx11::string>(this);
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((this->ptr_ & 0xfffffffffffffffcU) + 8);
  }
  std::__cxx11::string::_M_append((char *)pbVar1,(ulong)(other->_M_dataplus)._M_p);
  return;
}

Assistant:

void InternalMetadata::DoMergeFrom<std::string>(const std::string& other) {
  mutable_unknown_fields<std::string>()->append(other);
}